

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsBuilder.cpp
# Opt level: O3

void __thiscall
Refal2::COperationsBuilder::AddMatchRight_W
          (COperationsBuilder *this,CQualifier *qualifier,bool saveInTable)

{
  bool bVar1;
  TQualifierIndex pCVar2;
  CQualifier *this_00;
  COperation local_28;
  
  this_00 = qualifier;
  bVar1 = CQualifier::IsEmpty(qualifier);
  if (bVar1) {
    local_28.type = saveInTable + OT_MatchRight_W;
    CNodeList<Refal2::COperation>::Append(&this->operations,&local_28);
  }
  else {
    pCVar2 = registerQualifier((COperationsBuilder *)this_00,qualifier);
    local_28.type = saveInTable + OT_MatchRightWithQualifier_W;
    CNodeList<Refal2::COperation>::Append(&this->operations,&local_28);
    (((this->operations).last)->super_COperation).field_1.qualifier = pCVar2;
  }
  return;
}

Assistant:

void COperationsBuilder::AddMatchRight_W( CQualifier& qualifier,
	bool saveInTable )
{
	DEBUG_PRINT( __FUNCTION__ )
	if( qualifier.IsEmpty() ) {
		addNoArgumensOperation(
			( saveInTable ? OT_MatchRightSaveToTable_W : OT_MatchRight_W ) );
	} else {
		addQualifierIndexOperation(
			( saveInTable ? OT_MatchRightWithQualifierSaveToTable_W :
			 OT_MatchRightWithQualifier_W ), qualifier );
	}
}